

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * format<unsigned_long>
                   (string *__return_storage_ptr__,int fmt_num,string *fmt,unsigned_long arg)

{
  string local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  unsigned_long local_28;
  unsigned_long arg_local;
  string *fmt_local;
  string *psStack_10;
  int fmt_num_local;
  string *output;
  
  local_29 = 0;
  local_28 = arg;
  arg_local = (unsigned_long)fmt;
  fmt_local._4_4_ = fmt_num;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  format<int>(&local_90,fmt_local._4_4_);
  std::operator+(&local_70,'{',&local_90);
  std::operator+(&local_50,&local_70,'}');
  format<unsigned_long>(&local_c0,local_28);
  replace_positional(__return_storage_ptr__,&local_50,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (int fmt_num, const std::string& fmt, T arg)
{
    std::string output = fmt;
    replace_positional (output, '{' + format (fmt_num) + '}', format (arg));
    return output;
}